

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

EchoCanceller3 * webrtc::Config::default_value<webrtc::EchoCanceller3>(void)

{
  int iVar1;
  
  if (default_value<webrtc::EchoCanceller3>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::EchoCanceller3>()::def);
    if (iVar1 != 0) {
      default_value<webrtc::EchoCanceller3>::def = (EchoCanceller3 *)operator_new(1);
      default_value<webrtc::EchoCanceller3>::def->enabled = false;
      __cxa_guard_release(&default_value<webrtc::EchoCanceller3>()::def);
    }
  }
  return default_value<webrtc::EchoCanceller3>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }